

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

_Bool validRequestType(HTTPAPI_REQUEST_TYPE requestType)

{
  undefined1 local_d;
  _Bool result;
  HTTPAPI_REQUEST_TYPE requestType_local;
  
  if ((((requestType == HTTPAPI_REQUEST_GET) || (requestType == HTTPAPI_REQUEST_POST)) ||
      (requestType == HTTPAPI_REQUEST_PUT)) ||
     (((requestType == HTTPAPI_REQUEST_DELETE || (requestType == HTTPAPI_REQUEST_PATCH)) ||
      (requestType == HTTPAPI_REQUEST_HEAD)))) {
    local_d = true;
  }
  else {
    local_d = false;
  }
  return local_d;
}

Assistant:

static bool validRequestType(HTTPAPI_REQUEST_TYPE requestType)
{
    bool result;

    if ((requestType == HTTPAPI_REQUEST_GET) ||
        (requestType == HTTPAPI_REQUEST_POST) ||
        (requestType == HTTPAPI_REQUEST_PUT) ||
        (requestType == HTTPAPI_REQUEST_DELETE) ||
        (requestType == HTTPAPI_REQUEST_PATCH) ||
        (requestType == HTTPAPI_REQUEST_HEAD))
    {
        result = true;
    }
    else
    {
        result = false;
    }

    return result;
}